

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

string * __thiscall cfd::core::Psbt::GetBase64_abi_cxx11_(string *__return_storage_ptr__,Psbt *this)

{
  ByteData *data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  GetData((ByteData *)&_Stack_28,this);
  CryptoUtil::EncodeBase64_abi_cxx11_
            ((string *)__return_storage_ptr__,(CryptoUtil *)&_Stack_28,data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string Psbt::GetBase64() const {
  return CryptoUtil::EncodeBase64(GetData());
}